

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O2

void api_suite::api_ctor_initializer_list(void)

{
  undefined8 local_58;
  undefined4 local_4c;
  circular_array<int,_4UL> data;
  
  data.super_circular_view<int,_4UL>.member.data = (pointer)&data;
  data.super_array<int,_4UL>._M_elems[0] = 0xb;
  data.super_array<int,_4UL>._M_elems[1] = 0x16;
  data.super_array<int,_4UL>._M_elems[2] = 0;
  data.super_array<int,_4UL>._M_elems[3] = 0;
  data.super_circular_view<int,_4UL>.member.size = 2;
  data.super_circular_view<int,_4UL>.member.next = 2;
  local_58 = 2;
  local_4c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x47,"void api_suite::api_ctor_initializer_list()",&local_58,&local_4c);
  local_58 = 4;
  local_4c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x48,"void api_suite::api_ctor_initializer_list()",&local_58,&local_4c);
  return;
}

Assistant:

void api_ctor_initializer_list()
{
    circular_array<int, 4> data({11, 22});
    BOOST_TEST_EQ(data.size(), 2);
    BOOST_TEST_EQ(data.capacity(), 4);
}